

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thermoParser.h
# Opt level: O3

void __thiscall IO::ThermoParser::~ThermoParser(ThermoParser *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  std::vector<IO::Thermo,_std::allocator<IO::Thermo>_>::~vector(&this->thermos_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->lines_);
  pcVar1 = (this->thermo_file_string_)._M_dataplus._M_p;
  paVar2 = &(this->thermo_file_string_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
  }
  pcVar1 = (this->thermo_file_)._M_dataplus._M_p;
  paVar2 = &(this->thermo_file_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

~ThermoParser() {
        }